

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodeList.h
# Opt level: O1

void __thiscall
psy::C::
CoreSyntaxNodeList<psy::C::ExpressionSyntax*,psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax*>>
::acceptVisitor(CoreSyntaxNodeList<psy::C::ExpressionSyntax*,psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax*>>
                *this)

{
  Action AVar1;
  SyntaxVisitor *in_RSI;
  CoreSyntaxNodeList<psy::C::ExpressionSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax_*>_>
  *it;
  CoreSyntaxNodeList<psy::C::ExpressionSyntax*,psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax*>>
  *pCVar2;
  
  pCVar2 = this + -0x18;
  while ((*(SyntaxNode **)(pCVar2 + 8) == (SyntaxNode *)0x0 ||
         (AVar1 = SyntaxNode::acceptVisitor(*(SyntaxNode **)(pCVar2 + 8),in_RSI), AVar1 != Quit))) {
    pCVar2 = *(CoreSyntaxNodeList<psy::C::ExpressionSyntax*,psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax*>>
               **)(pCVar2 + 0x10);
    if (pCVar2 == (CoreSyntaxNodeList<psy::C::ExpressionSyntax*,psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax*>>
                   *)0x0) {
      return;
    }
  }
  return;
}

Assistant:

virtual SyntaxVisitor::Action acceptVisitor(SyntaxVisitor* visitor) override
    {
        for (auto it = this; it; it = it->next) {
            SyntaxNodeT node = static_cast<SyntaxNodeT>(it->value);
            if (node) {
                auto action = node->acceptVisitor(visitor);
                if (action == SyntaxVisitor::Action::Quit)
                    return action;
            }
        }
        return SyntaxVisitor::Action::Visit;
    }